

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3SrcListAssignCursors(Parse *pParse,SrcList *pList)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  
  if ((pList != (SrcList *)0x0) && (iVar2 = pList->nSrc, 0 < iVar2)) {
    pbVar4 = &pList->a[0].fg.field_0x1;
    iVar3 = 0;
    do {
      if (*(int *)(pbVar4 + 3) < 0) {
        iVar1 = pParse->nTab;
        pParse->nTab = iVar1 + 1;
        *(int *)(pbVar4 + 3) = iVar1;
        if ((*pbVar4 & 4) != 0) {
          sqlite3SrcListAssignCursors(pParse,*(SrcList **)(**(long **)(pbVar4 + 0x27) + 0x28));
          iVar2 = pList->nSrc;
        }
      }
      iVar3 = iVar3 + 1;
      pbVar4 = pbVar4 + 0x48;
    } while (iVar3 < iVar2);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListAssignCursors(Parse *pParse, SrcList *pList){
  int i;
  SrcItem *pItem;
  assert( pList || pParse->db->mallocFailed );
  if( ALWAYS(pList) ){
    for(i=0, pItem=pList->a; i<pList->nSrc; i++, pItem++){
      if( pItem->iCursor>=0 ) continue;
      pItem->iCursor = pParse->nTab++;
      if( pItem->fg.isSubquery ){
        assert( pItem->u4.pSubq!=0 );
        assert( pItem->u4.pSubq->pSelect!=0 );
        assert( pItem->u4.pSubq->pSelect->pSrc!=0 );
        sqlite3SrcListAssignCursors(pParse, pItem->u4.pSubq->pSelect->pSrc);
      }
    }
  }
}